

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

Sphere __thiscall rw::MorphTarget::calculateBoundingSphere(MorphTarget *this)

{
  float fVar1;
  int iVar2;
  V3d *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Sphere SVar11;
  
  iVar2 = this->parent->numVertices;
  if (iVar2 < 1) {
    fVar5 = -1e+06;
    fVar7 = -1e+06;
    fVar8 = -1e+06;
    fVar4 = 1e+06;
    fVar9 = 1e+06;
    fVar6 = 1e+06;
  }
  else {
    pVVar3 = this->vertices;
    fVar8 = -1e+06;
    fVar5 = -1e+06;
    fVar7 = -1e+06;
    fVar6 = 1e+06;
    fVar9 = 1e+06;
    fVar10 = 1e+06;
    do {
      fVar1 = (float)pVVar3->x;
      if (fVar5 < fVar1) {
        fVar5 = fVar1;
      }
      fVar4 = (float)pVVar3->y;
      if (fVar7 < fVar4) {
        fVar7 = fVar4;
      }
      if (fVar9 <= fVar1) {
        fVar1 = fVar9;
      }
      fVar9 = fVar1;
      if (fVar10 <= fVar4) {
        fVar4 = fVar10;
      }
      fVar10 = (float)pVVar3->z;
      fVar1 = fVar10;
      if (fVar10 <= fVar8) {
        fVar1 = fVar8;
      }
      fVar8 = fVar1;
      if (fVar6 <= fVar10) {
        fVar10 = fVar6;
      }
      fVar6 = fVar10;
      pVVar3 = pVVar3 + 1;
      iVar2 = iVar2 + -1;
      fVar10 = fVar4;
    } while (iVar2 != 0);
  }
  fVar10 = (fVar9 + fVar5) * 0.5;
  fVar9 = (fVar4 + fVar7) * 0.5;
  fVar6 = (fVar6 + fVar8) * 0.5;
  fVar5 = fVar5 - fVar10;
  fVar7 = fVar7 - fVar9;
  fVar8 = fVar8 - fVar6;
  fVar4 = fVar8 * fVar8 + fVar5 * fVar5 + fVar7 * fVar7;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  SVar11.radius = (float32)fVar4;
  SVar11.center.z = (float32)fVar6;
  SVar11.center.y = (float32)fVar9;
  SVar11.center.x = (float32)fVar10;
  return SVar11;
}

Assistant:

Sphere
MorphTarget::calculateBoundingSphere(void) const
{
	Sphere sphere;
	V3d min = {  1000000.0f,  1000000.0f,  1000000.0f };
	V3d max = { -1000000.0f, -1000000.0f, -1000000.0f };
	V3d *v = this->vertices;
	for(int32 j = 0; j < this->parent->numVertices; j++){
		if(v->x > max.x) max.x = v->x;
		if(v->x < min.x) min.x = v->x;
		if(v->y > max.y) max.y = v->y;
		if(v->y < min.y) min.y = v->y;
		if(v->z > max.z) max.z = v->z;
		if(v->z < min.z) min.z = v->z;
		v++;
	}
	sphere.center = scale(add(min, max), 1/2.0f);
	max = sub(max, sphere.center);
	sphere.radius = length(max);
	return sphere;
}